

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall google::protobuf::RepeatedField<double>::FastAdder::Add(FastAdder *this,double *val)

{
  double dVar1;
  RepeatedField<double> *this_00;
  double *pdVar2;
  int iVar3;
  
  iVar3 = this->index_;
  if (iVar3 == this->capacity_) {
    this_00 = this->repeated_field_;
    this_00->current_size_ = iVar3;
    Reserve(this_00,iVar3 + 1);
    this->capacity_ = this->repeated_field_->total_size_;
    pdVar2 = (double *)this->repeated_field_->arena_or_elements_;
    this->buffer_ = pdVar2;
    iVar3 = this->index_;
  }
  else {
    pdVar2 = this->buffer_;
  }
  dVar1 = *val;
  this->index_ = iVar3 + 1;
  pdVar2[iVar3] = dVar1;
  return;
}

Assistant:

void Add(const Element& val) {
      if (kIsPod) {
        if (index_ == capacity_) {
          repeated_field_->current_size_ = index_;
          repeated_field_->Reserve(index_ + 1);
          capacity_ = repeated_field_->total_size_;
          buffer_ = repeated_field_->unsafe_elements();
        }
        buffer_[index_++] = val;
      } else {
        repeated_field_->Add(val);
      }
    }